

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManSolve2(Cbs2_Man_t *p,int iLit,int iLit2)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x587,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
      (p->Pars).nJustThis = 0;
      (p->Pars).nBTThis = 0;
      (p->Pars).nBTThisNc = 0;
      Cbs2_ManAssign(p,iLit,0,0,0);
      if (iLit2 != 0) {
        Cbs2_ManAssign(p,iLit2,0,0,0);
      }
      iVar2 = Cbs2_ManSolve_rec(p,0);
      uVar4 = 1;
      if (iVar2 == 0) {
        iVar2 = Cbs2_ManCheckLimits(p);
        if (iVar2 == 0) {
          p_00 = p->vModel;
          p_00->nSize = 0;
          (p->pProp).iHead = 0;
          uVar4 = 0;
          for (lVar5 = 0;
              (lVar5 < (p->pProp).iTail && (iVar2 = (p->pProp).pData[lVar5], iVar2 != 0));
              lVar5 = lVar5 + 1) {
            iVar2 = Abc_Lit2Var(iVar2);
            iVar3 = Cbs2_VarValue(p,iVar2);
            iVar2 = Abc_Var2Lit(iVar2,(uint)(iVar3 == 0));
            Vec_IntPush(p_00,iVar2);
          }
        }
      }
      Cbs2_ManCancelUntil(p,0);
      Cbs2_ManCleanWatch(p);
      Cbs2_ManBumpClean(p);
      (p->pJust).iHead = 0;
      (p->pJust).iTail = 0;
      (p->pClauses).iHead = 1;
      (p->pClauses).iTail = 1;
      iVar2 = (p->Pars).nJustThis;
      piVar1 = &(p->Pars).nBTTotal;
      *piVar1 = *piVar1 + (p->Pars).nBTThis;
      iVar3 = (p->Pars).nJustTotal;
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      (p->Pars).nJustTotal = iVar2;
      iVar2 = Cbs2_ManCheckLimits(p);
      return -(uint)(iVar2 != 0) | uVar4;
    }
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x589,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                ,0x588,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
}

Assistant:

int Cbs2_ManSolve2( Cbs2_Man_t * p, int iLit, int iLit2 )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( iLit2 ) 
    Cbs2_ManAssign( p, iLit2, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModelAll( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}